

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O1

void testCopyDeepScanLine(string *tempDir)

{
  int iVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n",
             0x39);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  random_reseed(1);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_cc944::readCopyWriteTest(tempDir,1,100);
  anon_unknown.dwarf_cc944::readCopyWriteTest(tempDir,3,0x32);
  anon_unknown.dwarf_cc944::readCopyWriteTest(tempDir,10,10);
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void testCopyDeepScanLine (const std::string &tempDir)
{
    try
    {
        cout << "\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        
        readCopyWriteTest (tempDir,  1, 100);
        readCopyWriteTest (tempDir,  3,  50);
        readCopyWriteTest (tempDir, 10,  10);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}